

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::SupportVectorClassifier::Clear(SupportVectorClassifier *this)

{
  (this->numberofsupportvectorsperclass_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
            (&(this->coefficients_).super_RepeatedPtrFieldBase);
  (this->rho_).current_size_ = 0;
  (this->proba_).current_size_ = 0;
  (this->probb_).current_size_ = 0;
  if (this->kernel_ != (Kernel *)0x0) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->kernel_ = (Kernel *)0x0;
  clear_supportVectors(this);
  clear_ClassLabels(this);
  return;
}

Assistant:

void SupportVectorClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SupportVectorClassifier)
  numberofsupportvectorsperclass_.Clear();
  coefficients_.Clear();
  rho_.Clear();
  proba_.Clear();
  probb_.Clear();
  if (GetArenaNoVirtual() == NULL && kernel_ != NULL) {
    delete kernel_;
  }
  kernel_ = NULL;
  clear_supportVectors();
  clear_ClassLabels();
}